

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctaes.c
# Opt level: O2

void SaveBytes(uchar *data16,AES_state *s)

{
  int c;
  int b;
  long lVar1;
  int r;
  int iVar2;
  uint8_t v;
  byte bVar3;
  
  for (c = 0; c != 4; c = c + 1) {
    for (iVar2 = 0; iVar2 != 4; iVar2 = iVar2 + 1) {
      bVar3 = 0;
      for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
        bVar3 = bVar3 | ((s->slice[lVar1] >> (c + iVar2 * 4 & 0x1fU) & 1) != 0) <<
                        ((byte)lVar1 & 0x1f);
      }
      *data16 = bVar3;
      data16 = data16 + 1;
    }
  }
  return;
}

Assistant:

static void SaveBytes(unsigned char* data16, const AES_state *s) {
    int c;
    for (c = 0; c < 4; c++) {
        int r;
        for (r = 0; r < 4; r++) {
            int b;
            uint8_t v = 0;
            for (b = 0; b < 8; b++) {
                v |= ((s->slice[b] >> (r * 4 + c)) & 1) << b;
            }
            *(data16++) = v;
        }
    }
}